

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<float> fmt::v9::detail::dragonbox::to_decimal<float>(float x)

{
  undefined1 auVar1 [16];
  compute_mul_parity_result cVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  char cVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  cache_entry_type cache;
  ulong local_40;
  ulong local_38;
  
  uVar15 = (uint)x & 0x7fffff;
  uVar3 = (uint)x >> 0x17 & 0xff;
  if (uVar3 == 0) {
    uVar3 = 0xffffff6b;
    if (uVar15 == 0) {
      uVar14 = 0;
      uVar7 = 0;
      goto LAB_0022b66d;
    }
LAB_0022b42a:
    uVar13 = (int)(uVar3 * 0x4d105) >> 0x14;
    uVar14 = (ulong)uVar13;
    local_40 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                         (ulong)(0x20 - uVar13) * 8);
    iVar8 = ((int)((1 - uVar13) * 0x1a934f) >> 0x13) + uVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_40;
    auVar1 = (ZEXT416(uVar15 * 2 + 1 << ((byte)iVar8 & 0x1f)) << 0x20) * auVar1;
    uVar7 = auVar1._8_8_;
    uVar4 = uVar7 >> 0x20;
    uVar11 = uVar4 / 100;
    iVar10 = (int)(uVar4 / 100);
    iVar9 = (int)(uVar4 / 100);
    uVar3 = iVar9 * -100 + auVar1._12_4_;
    uVar17 = (uint)(local_40 >> (~(byte)iVar8 & 0x3f));
    if (uVar3 < uVar17) {
      if ((uVar3 != 0) ||
         ((((uint)x & 1) == 0 || ((auVar1 & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0))
         )) {
LAB_0022b500:
        if ((uint)(uVar7 >> 0x22) < 0x19) {
LAB_0022b694:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x480,"");
        }
        iVar8 = uVar13 - 1;
        do {
          uVar3 = (uint)uVar11;
          uVar15 = uVar3 * 0x40000000 | uVar3 * -0x3d70a3d7 >> 2;
          uVar11 = (ulong)uVar15;
          iVar8 = iVar8 + 2;
        } while (uVar15 < 0x28f5c29);
        goto LAB_0022b654;
      }
      iVar10 = iVar9 + -1;
      uVar3 = 100;
    }
    else if ((uVar3 <= uVar17) &&
            (local_38 = uVar7,
            cVar2 = cache_accessor<float>::compute_mul_parity(uVar15 * 2 - 1,&local_40,iVar8),
            uVar7 = local_38,
            (~uVar15 & (uint)((ushort)cVar2 >> 8) & 1) != 0 || ((ushort)cVar2 & 1) != 0))
    goto LAB_0022b500;
    uVar3 = uVar3 - (uVar17 >> 1);
    uVar13 = uVar3 + 5;
    if (100 < uVar13) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x103,"n is too large");
    }
    uVar13 = uVar13 * 0x199a;
    uVar16 = uVar13 >> 0x10;
    uVar17 = uVar16 + iVar10 * 10;
    uVar7 = (ulong)uVar17;
    if ((uVar13 & 0xffff) < 0x199a) {
      cVar2 = cache_accessor<float>::compute_mul_parity(uVar15 * 2,&local_40,iVar8);
      if ((uVar3 & 1) == ((ushort)cVar2 & 1)) {
        uVar7 = (ulong)(uVar17 - (uVar16 & (ushort)cVar2 >> 8 & 1));
      }
      else {
        uVar7 = (ulong)(uVar17 - 1);
      }
    }
  }
  else {
    uVar3 = uVar3 - 0x96;
    if (uVar15 != 0) {
      uVar15 = uVar15 | 0x800000;
      goto LAB_0022b42a;
    }
    uVar13 = (int)(uVar3 * 0x9a209 + -0x3fe1f) >> 0x15;
    uVar14 = (ulong)uVar13;
    cVar6 = (char)((int)(uVar13 * -0x1a934f) >> 0x13) + (char)uVar3;
    uVar7 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar13) * 8);
    bVar5 = 0x28 - cVar6;
    uVar11 = (uVar7 >> 0x18) + uVar7 >> (bVar5 & 0x3f);
    uVar15 = (uint)((uVar3 & 0xfffffffe) != 2) + (int)(uVar7 - (uVar7 >> 0x19) >> (bVar5 & 0x3f));
    uVar12 = uVar11 & 0xffffffff;
    uVar4 = uVar12 / 10;
    if ((uint)((int)(uVar12 / 10) * 10) < uVar15) {
      uVar13 = (int)(uVar7 >> (0x27U - cVar6 & 0x3f)) + 1U >> 1;
      if (uVar3 == 0xffffffdd) {
        uVar7 = (ulong)(uVar13 & 0xfffffffe);
      }
      else {
        uVar7 = (ulong)(uVar13 + (uVar13 < uVar15));
      }
      goto LAB_0022b66d;
    }
    if ((uint)uVar11 < 10) goto LAB_0022b694;
    iVar8 = uVar13 - 1;
    do {
      uVar3 = (uint)uVar4;
      uVar15 = uVar3 * 0x40000000 | uVar3 * -0x3d70a3d7 >> 2;
      uVar4 = (ulong)uVar15;
      iVar8 = iVar8 + 2;
    } while (uVar15 < 0x28f5c29);
LAB_0022b654:
    uVar13 = uVar3 * -0x33333333 >> 1 | (uint)((uVar3 * -0x33333333 & 1) != 0) << 0x1f;
    uVar15 = uVar13;
    if (uVar13 >= 0x1999999a) {
      uVar15 = uVar3;
    }
    uVar7 = (ulong)uVar15;
    uVar14 = (ulong)(iVar8 + (uint)(uVar13 < 0x1999999a));
  }
LAB_0022b66d:
  return (decimal_fp<float>)(uVar7 | uVar14 << 0x20);
}

Assistant:

static uint64_t get_cached_power(int k) noexcept {
    FMT_ASSERT(k >= float_info<float>::min_k && k <= float_info<float>::max_k,
               "k is out of range");
    static constexpr const uint64_t pow10_significands[] = {
        0x81ceb32c4b43fcf5, 0xa2425ff75e14fc32, 0xcad2f7f5359a3b3f,
        0xfd87b5f28300ca0e, 0x9e74d1b791e07e49, 0xc612062576589ddb,
        0xf79687aed3eec552, 0x9abe14cd44753b53, 0xc16d9a0095928a28,
        0xf1c90080baf72cb2, 0x971da05074da7bef, 0xbce5086492111aeb,
        0xec1e4a7db69561a6, 0x9392ee8e921d5d08, 0xb877aa3236a4b44a,
        0xe69594bec44de15c, 0x901d7cf73ab0acda, 0xb424dc35095cd810,
        0xe12e13424bb40e14, 0x8cbccc096f5088cc, 0xafebff0bcb24aaff,
        0xdbe6fecebdedd5bf, 0x89705f4136b4a598, 0xabcc77118461cefd,
        0xd6bf94d5e57a42bd, 0x8637bd05af6c69b6, 0xa7c5ac471b478424,
        0xd1b71758e219652c, 0x83126e978d4fdf3c, 0xa3d70a3d70a3d70b,
        0xcccccccccccccccd, 0x8000000000000000, 0xa000000000000000,
        0xc800000000000000, 0xfa00000000000000, 0x9c40000000000000,
        0xc350000000000000, 0xf424000000000000, 0x9896800000000000,
        0xbebc200000000000, 0xee6b280000000000, 0x9502f90000000000,
        0xba43b74000000000, 0xe8d4a51000000000, 0x9184e72a00000000,
        0xb5e620f480000000, 0xe35fa931a0000000, 0x8e1bc9bf04000000,
        0xb1a2bc2ec5000000, 0xde0b6b3a76400000, 0x8ac7230489e80000,
        0xad78ebc5ac620000, 0xd8d726b7177a8000, 0x878678326eac9000,
        0xa968163f0a57b400, 0xd3c21bcecceda100, 0x84595161401484a0,
        0xa56fa5b99019a5c8, 0xcecb8f27f4200f3a, 0x813f3978f8940985,
        0xa18f07d736b90be6, 0xc9f2c9cd04674edf, 0xfc6f7c4045812297,
        0x9dc5ada82b70b59e, 0xc5371912364ce306, 0xf684df56c3e01bc7,
        0x9a130b963a6c115d, 0xc097ce7bc90715b4, 0xf0bdc21abb48db21,
        0x96769950b50d88f5, 0xbc143fa4e250eb32, 0xeb194f8e1ae525fe,
        0x92efd1b8d0cf37bf, 0xb7abc627050305ae, 0xe596b7b0c643c71a,
        0x8f7e32ce7bea5c70, 0xb35dbf821ae4f38c, 0xe0352f62a19e306f};
    return pow10_significands[k - float_info<float>::min_k];
  }